

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::PotVecAccumulator::clear(PotVecAccumulator *this)

{
  Vector<double,_7U> *in_RDI;
  Vector<double,_7U> potVecZero;
  Vector<double,_7U> *this_00;
  Vector<double,_7U> local_40;
  
  in_RDI->data_[1] = 0.0;
  this_00 = (Vector<double,_7U> *)0x0;
  Vector<double,_7U>::Vector(&local_40,(double *)&stack0xffffffffffffffb8);
  Vector<double,_7U>::operator=(this_00,in_RDI);
  Vector<double,_7U>::operator=(this_00,in_RDI);
  Vector<double,_7U>::operator=(this_00,in_RDI);
  Vector<double,_7U>::operator=(this_00,in_RDI);
  in_RDI[4].data_[2] = 0.0;
  in_RDI[4].data_[3] = 0.0;
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      const Vector<RealType, N_INTERACTION_FAMILIES> potVecZero(0.0);
      Avg_     = potVecZero;
      Avg2_    = potVecZero;
      Val_     = potVecZero;
      Total_   = potVecZero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }